

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>_>
          *base,tuple<testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamGenerator<unsigned_char>_>
                *generators,bool is_end)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamIterator<unsigned_char>_>
  *p_Var1;
  ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>
  local_40;
  ParamIterator<unsigned_char> local_38;
  
  (this->
  super_ParamIteratorInterface<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01066638;
  this->base_ = base;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamGenerator<unsigned_char>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamGenerator<unsigned_char>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_char>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<unsigned_char>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>>
              *)&this->begin_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamGenerator<unsigned_char>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_00;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamGenerator<unsigned_char>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_char>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<unsigned_char>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>>,testing::internal::ParamIterator<unsigned_char>>
              *)&this->end_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  p_Var1 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamIterator<unsigned_char>_>
  ;
  if (is_end) {
    p_Var1 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamIterator<unsigned_char>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamIterator<unsigned_char>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>_>,_testing::internal::ParamIterator<unsigned_char>_>
                ,p_Var1);
  (this->current_value_).
  super___shared_ptr<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }